

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O1

void __thiscall cnn::AlignedMemoryPool::sys_alloc(AlignedMemoryPool *this,size_t cap)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  ulong uVar4;
  
  uVar1 = this->a->align;
  if (1 < (int)uVar1) {
    uVar4 = (cap + uVar1) - 1;
    cap = uVar4 - uVar4 % (ulong)uVar1;
  }
  this->capacity = cap;
  iVar2 = (*this->a->_vptr_MemAllocator[2])();
  this->mem = (void *)CONCAT44(extraout_var,iVar2);
  if ((void *)CONCAT44(extraout_var,iVar2) != (void *)0x0) {
    this->used = 0;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to allocate ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->capacity);
  std::endl<char,std::char_traits<char>>(poVar3);
  abort();
}

Assistant:

void sys_alloc(size_t cap) {
    capacity = a->round_up_align(cap);
    //std::cerr << "Allocating " << capacity << " ...\n";
    mem = a->malloc(capacity);
    if (!mem) { std::cerr << "Failed to allocate " << capacity << std::endl; abort(); }
    used = 0;
  }